

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void extend_frame_lowbd(uint8_t *data,int width,int height,ptrdiff_t stride,int border_horz,
                       int border_vert)

{
  int iVar1;
  byte *pbVar2;
  void *__src;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int i;
  uint8_t *data_p;
  int local_2c;
  
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    pbVar2 = (byte *)(in_RDI + local_2c * in_RCX);
    memset(pbVar2 + -(long)in_R8D,(uint)*pbVar2,(long)in_R8D);
    memset(pbVar2 + in_ESI,(uint)pbVar2[in_ESI + -1],(long)in_R8D);
  }
  __src = (void *)(in_RDI - in_R8D);
  for (local_2c = -in_R9D; iVar1 = in_EDX, local_2c < 0; local_2c = local_2c + 1) {
    memcpy((void *)((long)__src + local_2c * in_RCX),__src,(long)(in_ESI + in_R8D * 2));
  }
  while (local_2c = iVar1, local_2c < in_EDX + in_R9D) {
    memcpy((void *)((long)__src + local_2c * in_RCX),(void *)((long)__src + (in_EDX + -1) * in_RCX),
           (long)(in_ESI + in_R8D * 2));
    iVar1 = local_2c + 1;
  }
  return;
}

Assistant:

static void extend_frame_lowbd(uint8_t *data, int width, int height,
                               ptrdiff_t stride, int border_horz,
                               int border_vert) {
  uint8_t *data_p;
  int i;
  for (i = 0; i < height; ++i) {
    data_p = data + i * stride;
    memset(data_p - border_horz, data_p[0], border_horz);
    memset(data_p + width, data_p[width - 1], border_horz);
  }
  data_p = data - border_horz;
  for (i = -border_vert; i < 0; ++i) {
    memcpy(data_p + i * stride, data_p, width + 2 * border_horz);
  }
  for (i = height; i < height + border_vert; ++i) {
    memcpy(data_p + i * stride, data_p + (height - 1) * stride,
           width + 2 * border_horz);
  }
}